

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

Polynomial *
parsePolynomial(Polynomial *__return_storage_ptr__,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,int numstates,string *str)

{
  PolynomialParser P;
  string local_a8;
  PolynomialParser local_88;
  
  translateOperatorNames(&local_a8,str,numstates);
  PolynomialParser::PolynomialParser(&local_88,varnames,numstates,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  PolynomialParser::value(__return_storage_ptr__,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.mString._M_dataplus._M_p != &local_88.mString.field_2) {
    operator_delete(local_88.mString._M_dataplus._M_p,
                    local_88.mString.field_2._M_allocated_capacity + 1);
  }
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::~vector
            (&local_88.mResult.mOperands);
  if (local_88.mResult.mEvaluationValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mResult.mEvaluationValues.super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.mResult.mEvaluationValues.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.mResult.mEvaluationValues.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial parsePolynomial(const std::vector<std::string>& varnames, int numstates, const std::string& str)
{
  PolynomialParser P(varnames, numstates, translateOperatorNames(str, numstates));
  return P.value();
}